

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_page_merge(MDB_cursor *csrc,MDB_cursor *cdst)

{
  ushort uVar1;
  uint16_t uVar2;
  MDB_page *pMVar3;
  MDB_page *pMVar4;
  MDB_page *pMVar5;
  indx_t iVar6;
  int iVar7;
  uint uVar8;
  uint6 *puVar9;
  unsigned_short local_21c;
  uint16_t depth;
  uint snum;
  MDB_node *node;
  uint top;
  MDB_dbi dbi;
  MDB_cursor *m3;
  MDB_cursor *m2;
  MDB_node *s2;
  MDB_cursor mn;
  indx_t j;
  indx_t i;
  int rc;
  uint nkeys;
  MDB_val data;
  MDB_val key;
  MDB_node *srcnode;
  MDB_page *pdst;
  MDB_page *psrc;
  MDB_cursor *cdst_local;
  MDB_cursor *csrc_local;
  
  pMVar3 = csrc->mc_pg[csrc->mc_top];
  if (csrc->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"csrc->mc_snum > 1","mdb_page_merge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                    ,0x21e6);
  }
  if (cdst->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"cdst->mc_snum > 1","mdb_page_merge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                    ,0x21e7);
  }
  csrc_local._4_4_ = mdb_page_touch(cdst);
  if (csrc_local._4_4_ == 0) {
    pMVar4 = cdst->mc_pg[cdst->mc_top];
    iVar6 = (indx_t)((pMVar4->mp_pb).pb.pb_lower - 0x10 >> 1);
    mn.mc_ki[0x1e] = iVar6;
    if ((pMVar3->mp_flags & 0x20) == 0x20) {
      data.mv_data = (void *)(ulong)csrc->mc_db->md_pad;
      for (mn.mc_ki[0x1f] = 0; (uint)mn.mc_ki[0x1f] < (pMVar3->mp_pb).pb.pb_lower - 0x10 >> 1;
          mn.mc_ki[0x1f] = mn.mc_ki[0x1f] + 1) {
        iVar7 = mdb_node_add(cdst,mn.mc_ki[0x1e],(MDB_val *)&data.mv_data,(MDB_val *)0x0,0,0);
        if (iVar7 != 0) {
          return iVar7;
        }
        mn.mc_ki[0x1e] = mn.mc_ki[0x1e] + 1;
      }
    }
    else {
      for (mn.mc_ki[0x1f] = 0; (uint)mn.mc_ki[0x1f] < (pMVar3->mp_pb).pb.pb_lower - 0x10 >> 1;
          mn.mc_ki[0x1f] = mn.mc_ki[0x1f] + 1) {
        puVar9 = (uint6 *)((long)pMVar3->mp_ptrs +
                          (long)(int)(uint)pMVar3->mp_ptrs[mn.mc_ki[0x1f]] + -0x10);
        if ((mn.mc_ki[0x1f] == 0) && ((pMVar3->mp_flags & 1) == 1)) {
          mdb_cursor_copy(csrc,(MDB_cursor *)&s2);
          mn.mc_backup = (MDB_cursor *)0x0;
          iVar7 = mdb_page_search_lowest((MDB_cursor *)&s2);
          if (iVar7 != 0) {
            return iVar7;
          }
          if ((mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_flags & 0x20) == 0x20) {
            data.mv_data = (void *)(ulong)*(uint *)mn._32_8_;
          }
          else {
            data.mv_data = (void *)(ulong)*(ushort *)
                                           ((long)mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_ptrs +
                                           (long)(int)(uint)mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]
                                                            ->mp_ptrs[0] + -10);
          }
        }
        else {
          data.mv_data = (void *)(ulong)*(ushort *)((long)puVar9 + 6);
        }
        _rc = (ulong)(uint)*puVar9;
        data.mv_size = (long)puVar9 + (long)(int)(uint)*(ushort *)((long)puVar9 + 6) + 8;
        iVar7 = mdb_node_add(cdst,mn.mc_ki[0x1e],(MDB_val *)&data.mv_data,(MDB_val *)&rc,
                             (ulong)*puVar9,(uint)*(ushort *)((long)puVar9 + 4));
        if (iVar7 != 0) {
          return iVar7;
        }
        mn.mc_ki[0x1e] = mn.mc_ki[0x1e] + 1;
      }
    }
    csrc->mc_top = csrc->mc_top - 1;
    mdb_node_del(csrc,0);
    if (csrc->mc_ki[csrc->mc_top] == 0) {
      data.mv_data = (void *)0x0;
      iVar7 = mdb_update_key(csrc,(MDB_val *)&data.mv_data);
      if (iVar7 != 0) {
        csrc->mc_top = csrc->mc_top + 1;
        return iVar7;
      }
    }
    csrc->mc_top = csrc->mc_top + 1;
    pMVar3 = csrc->mc_pg[csrc->mc_top];
    csrc_local._4_4_ = mdb_page_loose(csrc,pMVar3);
    if (csrc_local._4_4_ == 0) {
      if ((pMVar3->mp_flags & 2) == 2) {
        csrc->mc_db->md_leaf_pages = csrc->mc_db->md_leaf_pages - 1;
      }
      else {
        csrc->mc_db->md_branch_pages = csrc->mc_db->md_branch_pages - 1;
      }
      uVar8 = (uint)csrc->mc_top;
      for (m3 = csrc->mc_txn->mt_cursors[csrc->mc_dbi]; m3 != (MDB_cursor *)0x0; m3 = m3->mc_next) {
        if ((csrc->mc_flags & 4) == 0) {
          _top = (MDB_xcursor *)m3;
        }
        else {
          _top = m3->mc_xcursor;
        }
        if ((_top != (MDB_xcursor *)csrc) && (csrc->mc_snum <= (_top->mx_cursor).mc_snum)) {
          if ((_top->mx_cursor).mc_pg[uVar8] == pMVar3) {
            (_top->mx_cursor).mc_pg[uVar8] = pMVar4;
            (_top->mx_cursor).mc_ki[uVar8] = (_top->mx_cursor).mc_ki[uVar8] + iVar6;
            (_top->mx_cursor).mc_ki[uVar8 - 1] = cdst->mc_ki[uVar8 - 1];
          }
          else if (((_top->mx_cursor).mc_pg[uVar8 - 1] == csrc->mc_pg[uVar8 - 1]) &&
                  (csrc->mc_ki[uVar8 - 1] < (_top->mx_cursor).mc_ki[uVar8 - 1])) {
            (_top->mx_cursor).mc_ki[uVar8 - 1] = (_top->mx_cursor).mc_ki[uVar8 - 1] - 1;
          }
          if ((((_top->mx_cursor).mc_xcursor != (MDB_xcursor *)0x0) &&
              (((((_top->mx_cursor).mc_xcursor)->mx_cursor).mc_flags & 1) != 0)) &&
             ((pMVar3->mp_flags & 2) == 2)) {
            pMVar5 = (_top->mx_cursor).mc_pg[uVar8];
            uVar1 = (_top->mx_cursor).mc_pg[uVar8]->mp_ptrs[(_top->mx_cursor).mc_ki[uVar8]];
            if ((*(ushort *)((long)pMVar5->mp_ptrs + (long)(int)(uint)uVar1 + -0xc) & 6) == 4) {
              (((_top->mx_cursor).mc_xcursor)->mx_cursor).mc_pg[0] =
                   (MDB_page *)
                   ((long)pMVar5->mp_ptrs +
                   (long)(int)(uint)*(ushort *)
                                     ((long)pMVar5->mp_ptrs + (long)(int)(uint)uVar1 + -10) +
                   (long)(int)(uint)uVar1 + -8);
            }
          }
        }
      }
      local_21c = cdst->mc_snum;
      uVar2 = cdst->mc_db->md_depth;
      mdb_cursor_pop(cdst);
      csrc_local._4_4_ = mdb_rebalance(cdst);
      if (uVar2 != cdst->mc_db->md_depth) {
        local_21c = (cdst->mc_db->md_depth - uVar2) + local_21c;
      }
      cdst->mc_snum = local_21c;
      cdst->mc_top = local_21c - 1;
    }
  }
  return csrc_local._4_4_;
}

Assistant:

static int
mdb_page_merge(MDB_cursor *csrc, MDB_cursor *cdst)
{
	MDB_page	*psrc, *pdst;
	MDB_node	*srcnode;
	MDB_val		 key, data;
	unsigned	 nkeys;
	int			 rc;
	indx_t		 i, j;

	psrc = csrc->mc_pg[csrc->mc_top];
	pdst = cdst->mc_pg[cdst->mc_top];

	DPRINTF(("merging page %"Y"u into %"Y"u", psrc->mp_pgno, pdst->mp_pgno));

	mdb_cassert(csrc, csrc->mc_snum > 1);	/* can't merge root page */
	mdb_cassert(csrc, cdst->mc_snum > 1);

	/* Mark dst as dirty. */
	if ((rc = mdb_page_touch(cdst)))
		return rc;

	/* get dst page again now that we've touched it. */
	pdst = cdst->mc_pg[cdst->mc_top];

	/* Move all nodes from src to dst.
	 */
	j = nkeys = NUMKEYS(pdst);
	if (IS_LEAF2(psrc)) {
		key.mv_size = csrc->mc_db->md_pad;
		key.mv_data = METADATA(psrc);
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			rc = mdb_node_add(cdst, j, &key, NULL, 0, 0);
			if (rc != MDB_SUCCESS)
				return rc;
			key.mv_data = (char *)key.mv_data + key.mv_size;
		}
	} else {
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			srcnode = NODEPTR(psrc, i);
			if (i == 0 && IS_BRANCH(psrc)) {
				MDB_cursor mn;
				MDB_node *s2;
				mdb_cursor_copy(csrc, &mn);
				mn.mc_xcursor = NULL;
				/* must find the lowest key below src */
				rc = mdb_page_search_lowest(&mn);
				if (rc)
					return rc;
				if (IS_LEAF2(mn.mc_pg[mn.mc_top])) {
					key.mv_size = mn.mc_db->md_pad;
					key.mv_data = LEAF2KEY(mn.mc_pg[mn.mc_top], 0, key.mv_size);
				} else {
					s2 = NODEPTR(mn.mc_pg[mn.mc_top], 0);
					key.mv_size = NODEKSZ(s2);
					key.mv_data = NODEKEY(s2);
				}
			} else {
				key.mv_size = srcnode->mn_ksize;
				key.mv_data = NODEKEY(srcnode);
			}

			data.mv_size = NODEDSZ(srcnode);
			data.mv_data = NODEDATA(srcnode);
			rc = mdb_node_add(cdst, j, &key, &data, NODEPGNO(srcnode), srcnode->mn_flags);
			if (rc != MDB_SUCCESS)
				return rc;
		}
	}

	DPRINTF(("dst page %"Y"u now has %u keys (%.1f%% filled)",
	    pdst->mp_pgno, NUMKEYS(pdst),
		(float)PAGEFILL(cdst->mc_txn->mt_env, pdst) / 10));

	/* Unlink the src page from parent and add to free list.
	 */
	csrc->mc_top--;
	mdb_node_del(csrc, 0);
	if (csrc->mc_ki[csrc->mc_top] == 0) {
		key.mv_size = 0;
		rc = mdb_update_key(csrc, &key);
		if (rc) {
			csrc->mc_top++;
			return rc;
		}
	}
	csrc->mc_top++;

	psrc = csrc->mc_pg[csrc->mc_top];
	/* If not operating on FreeDB, allow this page to be reused
	 * in this txn. Otherwise just add to free list.
	 */
	rc = mdb_page_loose(csrc, psrc);
	if (rc)
		return rc;
	if (IS_LEAF(psrc))
		csrc->mc_db->md_leaf_pages--;
	else
		csrc->mc_db->md_branch_pages--;
	{
		/* Adjust other cursors pointing to mp */
		MDB_cursor *m2, *m3;
		MDB_dbi dbi = csrc->mc_dbi;
		unsigned int top = csrc->mc_top;

		for (m2 = csrc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
			if (csrc->mc_flags & C_SUB)
				m3 = &m2->mc_xcursor->mx_cursor;
			else
				m3 = m2;
			if (m3 == csrc) continue;
			if (m3->mc_snum < csrc->mc_snum) continue;
			if (m3->mc_pg[top] == psrc) {
				m3->mc_pg[top] = pdst;
				m3->mc_ki[top] += nkeys;
				m3->mc_ki[top-1] = cdst->mc_ki[top-1];
			} else if (m3->mc_pg[top-1] == csrc->mc_pg[top-1] &&
				m3->mc_ki[top-1] > csrc->mc_ki[top-1]) {
				m3->mc_ki[top-1]--;
			}
			if (m3->mc_xcursor && (m3->mc_xcursor->mx_cursor.mc_flags & C_INITIALIZED) &&
				IS_LEAF(psrc)) {
				MDB_node *node = NODEPTR(m3->mc_pg[top], m3->mc_ki[top]);
				if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) == F_DUPDATA)
					m3->mc_xcursor->mx_cursor.mc_pg[0] = NODEDATA(node);
			}
		}
	}
	{
		unsigned int snum = cdst->mc_snum;
		uint16_t depth = cdst->mc_db->md_depth;
		mdb_cursor_pop(cdst);
		rc = mdb_rebalance(cdst);
		/* Did the tree height change? */
		if (depth != cdst->mc_db->md_depth)
			snum += cdst->mc_db->md_depth - depth;
		cdst->mc_snum = snum;
		cdst->mc_top = snum-1;
	}
	return rc;
}